

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

btVector3 orth(btVector3 *v)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float __x;
  float fVar8;
  float fVar9;
  float fVar10;
  btVector3 bVar11;
  float local_28;
  
  fVar7 = v->m_floats[0];
  fVar1 = (float)*(undefined8 *)(v->m_floats + 1);
  fVar9 = (float)((ulong)*(undefined8 *)(v->m_floats + 1) >> 0x20);
  fVar5 = fVar1 - fVar9 * 0.0;
  fVar10 = fVar9 * 0.0 - fVar7;
  local_28 = fVar7 * 0.0 + fVar1 * -0.0;
  fVar8 = fVar1 * 0.0 + -fVar9;
  fVar9 = fVar9 * 0.0 + fVar7 * -0.0;
  fVar7 = fVar1 * -0.0 + fVar7;
  fVar1 = local_28 * local_28 + fVar5 * fVar5 + fVar10 * fVar10;
  if (fVar1 < 0.0) {
    fVar6 = sqrtf(fVar1);
  }
  else {
    fVar6 = SQRT(fVar1);
  }
  __x = fVar7 * fVar7 + fVar8 * fVar8 + fVar9 * fVar9;
  if (__x < 0.0) {
    fVar2 = sqrtf(__x);
  }
  else {
    fVar2 = SQRT(__x);
  }
  if (fVar6 <= fVar2) {
    fVar1 = __x;
  }
  uVar3 = (int)((uint)(fVar2 < fVar6) << 0x1f) >> 0x1f;
  uVar4 = (int)((uint)(fVar2 < fVar6) << 0x1f) >> 0x1f;
  if (fVar6 <= fVar2) {
    local_28 = fVar7;
  }
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  bVar11.m_floats[1] = (float)((uint)fVar10 & uVar4 | ~uVar4 & (uint)fVar9) * fVar1;
  bVar11.m_floats[0] = (float)((uint)fVar5 & uVar3 | ~uVar3 & (uint)fVar8) * fVar1;
  bVar11.m_floats[2] = local_28 * fVar1;
  bVar11.m_floats[3] = 0.0;
  return (btVector3)bVar11.m_floats;
}

Assistant:

btVector3 orth(const btVector3 &v)
{
	btVector3 a=btCross(v,btVector3(0,0,1));
	btVector3 b=btCross(v,btVector3(0,1,0));
	if (a.length() > b.length())
	{
		return a.normalized();
	} else {
		return b.normalized();
	}
}